

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  xml_encoding xVar1;
  size_t sVar2;
  uint16_t *in_RDX;
  uint8_t *in_RSI;
  char_t *in_RDI;
  xml_encoding in_stack_00000010;
  size_t result;
  undefined4 in_stack_ffffffffffffffd0;
  xml_encoding xVar3;
  uint32_t *in_stack_ffffffffffffffe0;
  char_t *pcVar4;
  
  if (in_RDX != (uint16_t *)0x0) {
    xVar3 = *(xml_encoding *)(in_RDI + 0x2810);
    pcVar4 = in_RDI;
    xVar1 = get_write_native_encoding();
    if (xVar3 == xVar1) {
      (**(code **)(**(long **)(in_RDI + 0x2800) + 0x10))(*(long **)(in_RDI + 0x2800),in_RSI,in_RDX);
    }
    else {
      sVar2 = convert_buffer_output
                        (pcVar4,in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_RDI,
                         CONCAT44(xVar3,in_stack_ffffffffffffffd0),in_stack_00000010);
      (**(code **)(**(long **)(in_RDI + 0x2800) + 0x10))
                (*(long **)(in_RDI + 0x2800),in_RDI + 0x800,sVar2);
    }
  }
  return;
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer_output(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}